

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# d_fft_fftsg.c
# Opt level: O2

void mayer_dofft(t_sample *fz1,t_sample *fz2,int n,int sgn)

{
  undefined1 auVar1 [16];
  int iVar2;
  int iVar3;
  long lVar4;
  double *a;
  
  iVar3 = ooura_init(n * 2);
  a = ooura_buffer;
  if (iVar3 != 0) {
    lVar4 = 0;
    iVar2 = n;
    iVar3 = n;
    if (n < 1) {
      iVar2 = 0;
      iVar3 = 0;
    }
    while (iVar2 != 0) {
      auVar1._8_4_ = SUB84((double)*(float *)((long)fz2 + lVar4),0);
      auVar1._0_8_ = (double)*(float *)((long)fz1 + lVar4);
      auVar1._12_4_ = (int)((ulong)(double)*(float *)((long)fz2 + lVar4) >> 0x20);
      *(undefined1 (*) [16])((long)a + lVar4 * 4) = auVar1;
      lVar4 = lVar4 + 4;
      iVar2 = iVar2 + -1;
    }
    cdft(n * 2,sgn,a,ooura_bitrev,ooura_costab);
    for (lVar4 = 0; iVar3 != (int)lVar4; lVar4 = lVar4 + 1) {
      fz1[lVar4] = (float)*a;
      fz2[lVar4] = (float)a[1];
      a = a + 2;
    }
  }
  return;
}

Assistant:

EXTERN void mayer_dofft(t_sample *fz1, t_sample *fz2, int n, int sgn)
{
    FFTFLT *buf, *fp3;
    int i;
    t_sample *fp1, *fp2;
    if (!ooura_init(2*n))
        return;
    buf = ooura_buffer;
    for (i = 0, fp1 = fz1, fp2 = fz2, fp3 = buf; i < n; i++)
    {
        fp3[0] = *fp1++;
        fp3[1] = *fp2++;
        fp3 += 2;
    }
    cdft(2*n, sgn, buf, ooura_bitrev, ooura_costab);
    for (i = 0, fp1 = fz1, fp2 = fz2, fp3 = buf; i < n; i++)
    {
        *fp1++ = fp3[0];
        *fp2++ = fp3[1];
        fp3 += 2;
    }
}